

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::EarlyFragmentTestsCase::iterate
          (EarlyFragmentTestsCase *this)

{
  ostringstream *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderTargetType RVar2;
  Functional *this_01;
  TestLog *log;
  deUint32 dVar3;
  GLenum GVar4;
  ContextType type;
  GLSLVersion version;
  Functions *pFVar5;
  int *piVar6;
  long lVar7;
  ObjectTraits *pOVar8;
  ObjectWrapper *pOVar9;
  undefined8 *puVar10;
  long *plVar11;
  TestError *this_02;
  RenderTargetType RVar12;
  int iVar13;
  ulong *puVar14;
  long *plVar15;
  Surface *surface;
  RenderContext *renderContext;
  char *pcVar16;
  void *__buf;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  undefined8 uVar20;
  ulong uVar21;
  void *data;
  bool bVar22;
  CallLogWrapper glLog;
  uint local_494;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  testAttachment;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  colorAttachment;
  Surface rendered;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  undefined4 local_428;
  TestLog *local_420;
  uint local_414;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  fbo;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  long *local_3c0;
  undefined8 local_3b8;
  long local_3b0;
  undefined8 uStack_3a8;
  long *local_3a0;
  undefined8 local_398;
  long local_390;
  undefined8 uStack_388;
  EarlyFragmentTestsCase *local_380;
  ulong *local_378;
  long local_370;
  ulong local_368;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  string local_358;
  long *local_338;
  long local_330;
  long local_328;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  Texture texture;
  string glslVersionDeclaration;
  UniformAccessLogger uniforms;
  Random rnd;
  undefined1 local_288 [8];
  _Alloc_hider _Stack_280;
  undefined1 local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  pointer pbStack_250;
  int local_248;
  float *local_240;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [40];
  LayeredImage src;
  ios_base local_138 [32];
  deUint32 local_118;
  bool local_f0;
  
  this_01 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pFVar5 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
  local_420 = log;
  glu::CallLogWrapper::CallLogWrapper(&glLog,pFVar5,log);
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar3);
  RVar2 = this->m_renderTarget;
  bVar22 = this->m_useEarlyTests;
  uVar17 = 0;
  local_494 = 0;
  if (RVar2 == RENDERTARGET_DEFAULT) {
    piVar6 = (int *)(**(code **)(*(long *)this_01 + 0x20))(this_01);
    iVar13 = *piVar6;
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    local_494 = 0;
    uVar17 = dVar3 % (iVar13 - 0x1fU);
    if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
      lVar7 = (**(code **)(*(long *)this_01 + 0x20))(this_01);
      iVar13 = *(int *)(lVar7 + 4);
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      local_494 = dVar3 % (iVar13 - 0x1fU);
    }
  }
  pFVar5 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))();
  pOVar8 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&texture.super_ObjectWrapper,pFVar5,pOVar8);
  fbo.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  colorAttachment.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  testAttachment.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  glLog.m_enableLog = true;
  this_00 = (ostringstream *)(src.m_size.m_data + 1);
  src._0_8_ = local_420;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&src,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,0xde1,texture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexParameteri(&glLog,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(&glLog,0xde1,0x2800,0x2600);
  local_288._0_4_ = R;
  local_288._4_4_ = UNSIGNED_INT32;
  LayeredImage::LayeredImage(&src,TEXTURETYPE_2D,(TextureFormat *)local_288,1,1,1);
  local_288._0_4_ = R;
  local_288._4_4_ = SNORM_INT8;
  _Stack_280._M_p = (pointer)0x0;
  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
            ((LayeredImage *)&src,0,0,0,(Vector<int,_4> *)local_288);
  uploadTexture(&glLog,&src,0);
  LayeredImage::~LayeredImage(&src);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,0x8236);
  lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xba3);
  if (this->m_renderTarget - RENDERTARGET_FBO < 2) {
    pOVar9 = (ObjectWrapper *)operator_new(0x18);
    pFVar5 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
    pOVar8 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar9,pFVar5,pOVar8);
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    if (&(fbo.
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar9) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset(&fbo.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             );
      fbo.
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar9;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)&src);
    pOVar9 = (ObjectWrapper *)operator_new(0x18);
    pFVar5 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
    pOVar8 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar9,pFVar5,pOVar8);
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    if (&(colorAttachment.
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar9) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&colorAttachment.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      colorAttachment.
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar9;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)&src);
    pOVar9 = (ObjectWrapper *)operator_new(0x18);
    pFVar5 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
    pOVar8 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar9,pFVar5,pOVar8);
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    if (&(testAttachment.
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar9) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&testAttachment.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      testAttachment.
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar9;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)&src);
    glu::CallLogWrapper::glBindRenderbuffer
              (&glLog,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x8058,0x20,0x20);
    lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"gen color attachment rb",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbaf);
    glu::CallLogWrapper::glBindFramebuffer
              (&glLog,0x8d40,
               ((fbo.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&glLog,0x8d40,0x8ce0,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"set fbo color attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbb3);
    RVar12 = this->m_renderTarget ^ RENDERTARGET_FBO;
    if (RVar12 == RENDERTARGET_DEFAULT && this->m_type == TESTTYPE_DEPTH) {
      glu::CallLogWrapper::glBindRenderbuffer
                (&glLog,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x81a5,0x20,0x20);
      lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar3,"gen depth attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbb9);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                (&glLog,0x8d40,0x8d00,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      iVar13 = 0xbbc;
      pcVar19 = "set fbo depth attachment";
LAB_01484a30:
      glu::checkError(dVar3,pcVar19,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,iVar13);
    }
    else if (RVar12 == RENDERTARGET_DEFAULT && this->m_type == TESTTYPE_STENCIL) {
      glu::CallLogWrapper::glBindRenderbuffer
                (&glLog,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x8d48,0x20,0x20);
      lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar3,"gen stencil attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbc2);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                (&glLog,0x8d40,0x8d20,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar3 = (**(code **)(lVar7 + 0x800))();
      iVar13 = 0xbc5;
      pcVar19 = "set fbo stencil attachment";
      goto LAB_01484a30;
    }
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&glLog,0x8d40,0x8ce0,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"setup fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbc9);
    GVar4 = glu::CallLogWrapper::glCheckFramebufferStatus(&glLog,0x8d40);
    if (GVar4 != 0x8cd5) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,(char *)0x0,
                 "glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                 ,0xbca);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  glu::CallLogWrapper::glClearColor(&glLog,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glClear(&glLog,0x4000);
  if (this->m_type == TESTTYPE_STENCIL) {
    glu::CallLogWrapper::glClearStencil(&glLog,0);
    glu::CallLogWrapper::glClear(&glLog,0x400);
    glu::CallLogWrapper::glScissor(&glLog,uVar17,local_494,0x10,0x20);
    glu::CallLogWrapper::glEnable(&glLog,0xc11);
    glu::CallLogWrapper::glClearStencil(&glLog,1);
    glu::CallLogWrapper::glClear(&glLog,0x400);
    glu::CallLogWrapper::glDisable(&glLog,0xc11);
    glu::CallLogWrapper::glStencilFunc(&glLog,0x202,1,1);
    GVar4 = 0xb90;
    glu::CallLogWrapper::glStencilOp(&glLog,0x1e00,0x1e00,0x1e00);
LAB_01484bb5:
    glu::CallLogWrapper::glEnable(&glLog,GVar4);
  }
  else if (this->m_type == TESTTYPE_DEPTH) {
    glu::CallLogWrapper::glClearDepthf(&glLog,0.5);
    GVar4 = 0xb71;
    glu::CallLogWrapper::glClear(&glLog,0x100);
    goto LAB_01484bb5;
  }
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this_01 + 0x10))(this_01);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar19 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar19,(allocator<char> *)&src);
  memset(local_288,0,0xac);
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&__str);
  uniforms.m_gl = (Functions *)((ulong)uniforms.m_gl._4_4_ << 0x20);
  uniforms.m_log = (TestLog *)&uniforms.m_uniformLocations;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&uniforms.m_log,__str._M_dataplus._M_p,
             __str._M_dataplus._M_p + __str._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + ((ulong)uniforms.m_gl & 0xffffffff) * 0x18),
              (value_type *)&uniforms.m_log);
  paVar1 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str_1,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&__str_1);
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_358,this_01,renderContext);
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar1) {
    uVar20 = __str_1.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < local_358._M_string_length + __str_1._M_string_length) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      uVar20 = local_358.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_358._M_string_length + __str_1._M_string_length) goto LAB_01484d4b;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_358,0,(char *)0x0,(ulong)__str_1._M_dataplus._M_p);
  }
  else {
LAB_01484d4b:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&__str_1,(ulong)local_358._M_dataplus._M_p);
  }
  local_3c0 = &local_3b0;
  plVar11 = puVar10 + 2;
  if ((long *)*puVar10 == plVar11) {
    local_3b0 = *plVar11;
    uStack_3a8 = puVar10[3];
  }
  else {
    local_3b0 = *plVar11;
    local_3c0 = (long *)*puVar10;
  }
  local_3b8 = puVar10[1];
  *puVar10 = plVar11;
  puVar10[1] = 0;
  *(undefined1 *)plVar11 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  puVar14 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar14) {
    local_368 = *puVar14;
    uStack_360 = (undefined4)plVar11[3];
    uStack_35c = *(undefined4 *)((long)plVar11 + 0x1c);
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar14;
    local_378 = (ulong *)*plVar11;
  }
  local_370 = plVar11[1];
  *plVar11 = (long)puVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  pcVar19 = "";
  if (this->m_useEarlyTests != false) {
    pcVar19 = "layout (early_fragment_tests) in;\n\n";
  }
  local_400 = local_3f0;
  pcVar16 = pcVar19 + 0x23;
  if (this->m_useEarlyTests == false) {
    pcVar16 = pcVar19;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,pcVar19,pcVar16);
  uVar21 = 0xf;
  if (local_378 != &local_368) {
    uVar21 = local_368;
  }
  if (uVar21 < (ulong)(local_3f8 + local_370)) {
    uVar21 = 0xf;
    if (local_400 != local_3f0) {
      uVar21 = local_3f0[0];
    }
    if ((ulong)(local_3f8 + local_370) <= uVar21) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,(ulong)local_378);
      goto LAB_01484ee4;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_400);
LAB_01484ee4:
  local_3a0 = &local_390;
  plVar11 = puVar10 + 2;
  if ((long *)*puVar10 == plVar11) {
    local_390 = *plVar11;
    uStack_388 = puVar10[3];
  }
  else {
    local_390 = *plVar11;
    local_3a0 = (long *)*puVar10;
  }
  local_398 = puVar10[1];
  *puVar10 = plVar11;
  puVar10[1] = 0;
  *(undefined1 *)plVar11 = 0;
  local_414 = uVar17;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  plVar15 = plVar11 + 2;
  if ((long *)*plVar11 == plVar15) {
    local_328 = *plVar15;
    uStack_320 = (undefined4)plVar11[3];
    uStack_31c = *(undefined4 *)((long)plVar11 + 0x1c);
    local_338 = &local_328;
  }
  else {
    local_328 = *plVar15;
    local_338 = (long *)*plVar11;
  }
  local_330 = plVar11[1];
  *plVar11 = (long)plVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  rendered.m_width = 1;
  rendered.m_pixels.m_ptr = &local_438;
  local_380 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rendered.m_pixels,local_338,local_330 + (long)local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + (rendered._0_8_ & 0xffffffff) * 0x18),(value_type *)&rendered.m_pixels
             );
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)&src,(RenderContext *)this_01,(ProgramSources *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rendered.m_pixels.m_ptr != &local_438) {
    operator_delete(rendered.m_pixels.m_ptr,local_438._M_allocated_capacity + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,local_390 + 1);
  }
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar1) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)uniforms.m_log != &uniforms.m_uniformLocations) {
    operator_delete(uniforms.m_log,uniforms.m_uniformLocations._M_t._M_impl._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  uniforms.m_gl = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_log = local_420;
  uniforms.m_programGL = local_118;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(local_420,(ShaderProgram *)&src);
  uVar17 = local_414;
  if (local_f0 == false) {
    tcu::TestContext::setTestResult
              ((local_380->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_118);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"a_position","");
    rendered.m_width = 1;
    rendered.m_pixels.m_ptr = &local_438;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&rendered.m_pixels,__str._M_dataplus._M_p,
               __str._M_dataplus._M_p + __str._M_string_length);
    local_428 = 0;
    local_288._0_4_ = rendered.m_width;
    _Stack_280._M_p = (pointer)&local_270;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_280,rendered.m_pixels.m_ptr,
               rendered.m_pixels.m_cap + (long)rendered.m_pixels.m_ptr);
    local_270.field_2._M_allocated_capacity._0_4_ = local_428;
    local_270.field_2._8_8_ = (pointer)0x8;
    pbStack_250 = (pointer)0x400000003;
    local_248 = 0;
    local_240 = iterate::vertexPositions;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rendered.m_pixels.m_ptr != &local_438) {
      operator_delete(rendered.m_pixels.m_ptr,local_438._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glViewport(&glLog,uVar17,local_494,0x20,0x20);
    rendered.m_width = 0;
    rendered.m_height = 6;
    rendered.m_pixels.m_ptr = (void *)CONCAT44(rendered.m_pixels.m_ptr._4_4_,1);
    rendered.m_pixels.m_cap = (size_t)iterate::indices;
    glu::draw((RenderContext *)this_01,local_118,1,(VertexArrayBinding *)local_288,
              (PrimitiveList *)&rendered,(DrawUtilCallback *)0x0);
    lVar7 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xc2b);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_280._M_p !=
        &local_270) {
      operator_delete(_Stack_280._M_p,(ulong)(local_270._M_dataplus._M_p + 1));
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&src);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != false) {
    tcu::Surface::Surface(&rendered,0x20,0x20);
    local_288._0_4_ = RGBA;
    local_288._4_4_ = UNORM_INT8;
    data = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      data = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&src,(TextureFormat *)local_288,rendered.m_width,
               rendered.m_height,1,data);
    glu::readPixels((RenderContext *)this_01,uVar17,local_494,(PixelBufferAccess *)&src);
    local_288 = (undefined1  [8])local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"Rendered","");
    uniforms.m_gl = (Functions *)&uniforms.m_programGL;
    std::__cxx11::string::_M_construct<char_const*>((string *)&uniforms,"Rendered image","");
    surface = &rendered;
    tcu::LogImage::LogImage
              ((LogImage *)&src,(string *)local_288,(string *)&uniforms,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&src,(int)local_420,__buf,(size_t)surface);
    if (src.m_texBuffer.m_state != (SharedPtrStateBase *)&src.m_tex2D.m_state) {
      operator_delete(src.m_texBuffer.m_state,
                      (ulong)((long)&(src.m_tex2D.m_state)->_vptr_SharedPtrStateBase + 1));
    }
    if ((TextureFormat *)src._0_8_ != &src.m_format) {
      operator_delete((void *)src._0_8_,(long)src.m_format + 1);
    }
    if (uniforms.m_gl != (Functions *)&uniforms.m_programGL) {
      operator_delete(uniforms.m_gl,CONCAT44(uniforms._20_4_,uniforms.m_programGL) + 1);
    }
    if (local_288 != (undefined1  [8])local_278) {
      operator_delete((void *)local_288,(ulong)((long)local_278 + 1));
    }
    tcu::Surface::~Surface(&rendered);
    lVar7 = (**(code **)(*(long *)this_01 + 0x20))(this_01);
    iVar13 = 1;
    if (1 < *(int *)(lVar7 + 0x20)) {
      iVar13 = *(int *)(lVar7 + 0x20);
    }
    bVar22 = (RVar2 != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT & bVar22) == 0;
    src.m_size.m_data[1] = 0x1a0;
    if (bVar22) {
      src.m_size.m_data[1] = 0x400;
    }
    iVar18 = 0x260;
    if (bVar22) {
      iVar18 = 0x400;
    }
    src.m_size.m_data[2] = iVar18 * iVar13;
    uniforms.m_gl = (Functions *)0x2100000000;
    local_288 = (undefined1  [8])&DAT_100000001;
    _Stack_280._M_p._0_4_ = 1;
    src._0_8_ = &PTR_operator___02158140;
    bVar22 = readIntegerTextureViaFBOAndVerify
                       ((RenderContext *)this_01,&glLog,texture.super_ObjectWrapper.m_object,
                        TEXTURETYPE_2D,(TextureFormat *)&uniforms,(IVec3 *)local_288,
                        (ImageLayerVerifier *)&src);
    pcVar19 = "Got wrong value";
    if (bVar22) {
      pcVar19 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_380->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar22,
               pcVar19);
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::reset(&testAttachment.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
         );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::reset(&colorAttachment.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
         );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset(&fbo.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
         );
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

EarlyFragmentTestsCase::IterateResult EarlyFragmentTestsCase::iterate (void)
{
	const RenderContext&			renderCtx			= m_context.getRenderContext();
	TestLog&						log					(m_testCtx.getLog());
	glu::CallLogWrapper				glLog				(renderCtx.getFunctions(), log);
	de::Random						rnd					(deStringHash(getName()));
	const bool						expectPartialResult	= m_useEarlyTests && m_renderTarget != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT;
	const int						viewportWidth		= RENDER_SIZE;
	const int						viewportHeight		= RENDER_SIZE;
	const int						viewportX			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getWidth() - viewportWidth))	: (0);
	const int						viewportY			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getHeight() - viewportHeight))	: (0);
	const glu::Texture				texture				(renderCtx);
	de::MovePtr<glu::Framebuffer>	fbo;
	de::MovePtr<glu::Renderbuffer>	colorAttachment;
	de::MovePtr<glu::Renderbuffer>	testAttachment;

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(GL_TEXTURE_2D, *texture);
	setTexParameteri(glLog, GL_TEXTURE_2D);
	{
		LayeredImage src(TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32), 1, 1, 1);
		src.setPixel(0, 0, 0, IVec4(0));
		uploadTexture(glLog, src, 0 /* always 2d texture, no buffer needed */);
	}
	glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_R32UI);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	// Set up framebuffer
	if (m_renderTarget == RENDERTARGET_FBO ||
		m_renderTarget == RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT)
	{
		fbo				= de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(renderCtx));
		colorAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));
		testAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));

		glLog.glBindRenderbuffer(GL_RENDERBUFFER, **colorAttachment);
		glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen color attachment rb");

		glLog.glBindFramebuffer(GL_FRAMEBUFFER, **fbo);
		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo color attachment");

		if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_DEPTH)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT16, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen depth attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo depth attachment");
		}
		else if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_STENCIL)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen stencil attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo stencil attachment");
		}

		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "setup fbo");
		TCU_CHECK(glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}

	// Set up appropriate conditions for the test.

	glLog.glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
	glLog.glClear(GL_COLOR_BUFFER_BIT);

	if (m_type == TESTTYPE_DEPTH)
	{
		glLog.glClearDepthf(0.5f);
		glLog.glClear(GL_DEPTH_BUFFER_BIT);
		glLog.glEnable(GL_DEPTH_TEST);
	}
	else if (m_type == TESTTYPE_STENCIL)
	{
		glLog.glClearStencil(0);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glScissor(viewportX, viewportY, viewportWidth/2, viewportHeight);
		glLog.glEnable(GL_SCISSOR_TEST);
		glLog.glClearStencil(1);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glDisable(GL_SCISSOR_TEST);
		glLog.glStencilFunc(GL_EQUAL, 1, 1);
		glLog.glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
		glLog.glEnable(GL_STENCIL_TEST);
	}
	else
		DE_ASSERT(false);

	// Perform image stores in fragment shader.

	{
		const std::string glslVersionDeclaration = glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		// Generate fragment shader.

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::VertexSource(		glslVersionDeclaration + "\n"
															"\n"
															"highp in vec3 a_position;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	gl_Position = vec4(a_position, 1.0);\n"
															"}\n")

								  << glu::FragmentSource(	glslVersionDeclaration + "\n"
															+ imageAtomicExtensionShaderRequires(renderCtx) +
															"\n"
															+ string(m_useEarlyTests ? "layout (early_fragment_tests) in;\n\n" : "") +
															"layout (location = 0) out highp vec4 o_color;\n"
															"\n"
															"precision highp uimage2D;\n"
															"\n"
															"layout (r32ui, binding=0) coherent uniform uimage2D u_image;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	imageAtomicAdd(u_image, ivec2(0, 0), uint(1));\n"
															"	o_color = vec4(1.0);\n"
															"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and draw full-viewport quad.

		glLog.glUseProgram(program.getProgram());

		{
			static const float vertexPositions[4*3] =
			{
				-1.0, -1.0, -1.0f,
				 1.0, -1.0,  0.0f,
				-1.0,  1.0,  0.0f,
				 1.0,  1.0,  1.0f,
			};

			static const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("a_position", 3, 4, 0, &vertexPositions[0])
			};

			glLog.glViewport(viewportX, viewportY, viewportWidth, viewportHeight);

			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Draw failed");
		}
	}

	// Log rendered result for convenience.
	{
		tcu::Surface rendered(viewportWidth, viewportHeight);
		glu::readPixels(renderCtx, viewportX, viewportY, rendered.getAccess());
		log << TestLog::Image("Rendered", "Rendered image", rendered);
	}

	// Read counter value and check.
	{
		const int numSamples		= de::max(1, renderCtx.getRenderTarget().getNumSamples());
		const int expectedCounter	= expectPartialResult ? viewportWidth*viewportHeight/2				: viewportWidth*viewportHeight;
		const int tolerance			= expectPartialResult ? de::max(viewportWidth, viewportHeight)*3	: 0;
		const int expectedMin		= de::max(0, expectedCounter - tolerance);
		const int expectedMax		= (expectedCounter + tolerance) * numSamples;

		if (readIntegerTextureViaFBOAndVerify(renderCtx, glLog, *texture, TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32),
											  IVec3(1, 1, 1), R32UIImageSingleValueVerifier(expectedMin, expectedMax)))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong value");

		return STOP;
	}
}